

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

string * StripAnsiEscapeCodes(string *__return_storage_ptr__,string *in)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  byte local_59;
  ulong local_38;
  size_t i;
  string *in_local;
  string *stripped;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  local_38 = 0;
  do {
    uVar2 = std::__cxx11::string::size();
    if (uVar2 <= local_38) {
      return __return_storage_ptr__;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in);
    if (*pcVar3 == '\x1b') {
      uVar2 = std::__cxx11::string::size();
      if (uVar2 <= local_38 + 1) {
        return __return_storage_ptr__;
      }
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in);
      if (*pcVar3 == '[') {
        local_38 = local_38 + 2;
        while( true ) {
          uVar2 = std::__cxx11::string::size();
          local_59 = 0;
          if (local_38 < uVar2) {
            pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in);
            bVar1 = islatinalpha((int)*pcVar3);
            local_59 = bVar1 ^ 0xff;
          }
          if ((local_59 & 1) == 0) break;
          local_38 = local_38 + 1;
        }
      }
    }
    else {
      std::__cxx11::string::operator[]((ulong)in);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

string StripAnsiEscapeCodes(const string& in) {
  string stripped;
  stripped.reserve(in.size());

  for (size_t i = 0; i < in.size(); ++i) {
    if (in[i] != '\33') {
      // Not an escape code.
      stripped.push_back(in[i]);
      continue;
    }

    // Only strip CSIs for now.
    if (i + 1 >= in.size()) break;
    if (in[i + 1] != '[') continue;  // Not a CSI.
    i += 2;

    // Skip everything up to and including the next [a-zA-Z].
    while (i < in.size() && !islatinalpha(in[i]))
      ++i;
  }
  return stripped;
}